

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_context_init__alsa
                    (ma_context *pContext,ma_context_config *pConfig,
                    ma_backend_callbacks *pCallbacks)

{
  ma_result mVar1;
  ma_handle handle;
  ma_proc p_Var2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (lVar3 == 8) {
      handle = (pContext->field_14).alsa.asoundSO;
      if (handle == (ma_handle)0x0) {
        ma_log_postf(pContext->pLog,4,"[ALSA] Failed to open shared object.\n");
        return MA_NO_BACKEND;
      }
      break;
    }
    handle = ma_dlopen(pContext,(char *)((long)&DAT_001ad6a0 +
                                        (long)*(int *)((long)&DAT_001ad6a0 + lVar3)));
    (pContext->field_14).alsa.asoundSO = handle;
    lVar3 = lVar3 + 4;
  } while (handle == (ma_handle)0x0);
  p_Var2 = ma_dlsym(pContext,handle,"snd_pcm_open");
  (pContext->field_14).alsa.snd_pcm_open = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_close");
  (pContext->field_14).alsa.snd_pcm_close = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_sizeof");
  (pContext->field_14).alsa.snd_pcm_hw_params_sizeof = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_any");
  (pContext->field_14).alsa.snd_pcm_hw_params_any = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_set_format");
  (pContext->field_14).alsa.snd_pcm_hw_params_set_format = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_set_format_first"
                   );
  (pContext->field_14).alsa.snd_pcm_hw_params_set_format_first = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_get_format_mask")
  ;
  (pContext->field_14).alsa.snd_pcm_hw_params_get_format_mask = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_set_channels");
  (pContext->field_14).alsa.snd_pcm_hw_params_set_channels = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,
                    "snd_pcm_hw_params_set_channels_near");
  (pContext->field_14).alsa.snd_pcm_hw_params_set_channels_near = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,
                    "snd_pcm_hw_params_set_channels_minmax");
  (pContext->field_14).alsa.snd_pcm_hw_params_set_channels_minmax = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,
                    "snd_pcm_hw_params_set_rate_resample");
  (pContext->field_14).alsa.snd_pcm_hw_params_set_rate_resample = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_set_rate");
  (pContext->field_14).alsa.snd_pcm_hw_params_set_rate = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_set_rate_near");
  (pContext->field_14).alsa.snd_pcm_hw_params_set_rate_near = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,
                    "snd_pcm_hw_params_set_buffer_size_near");
  (pContext->field_14).alsa.snd_pcm_hw_params_set_buffer_size_near = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_set_periods_near"
                   );
  (pContext->field_14).alsa.snd_pcm_hw_params_set_periods_near = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_set_access");
  (pContext->field_14).alsa.snd_pcm_hw_params_set_access = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_get_format");
  (pContext->field_14).alsa.snd_pcm_hw_params_get_format = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_get_channels");
  (pContext->field_14).alsa.snd_pcm_hw_params_get_channels = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_get_channels_min"
                   );
  (pContext->field_14).alsa.snd_pcm_hw_params_get_channels_min = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_get_channels_max"
                   );
  (pContext->field_14).alsa.snd_pcm_hw_params_get_channels_max = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_get_rate");
  (pContext->field_14).alsa.snd_pcm_hw_params_get_rate = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_get_rate_min");
  (pContext->field_14).alsa.snd_pcm_hw_params_get_rate_min = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_get_rate_max");
  (pContext->field_14).alsa.snd_pcm_hw_params_get_rate_max = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_get_buffer_size")
  ;
  (pContext->field_14).alsa.snd_pcm_hw_params_get_buffer_size = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_get_periods");
  (pContext->field_14).alsa.snd_pcm_hw_params_get_periods = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_get_access");
  (pContext->field_14).alsa.snd_pcm_hw_params_get_access = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_test_format");
  (pContext->field_14).alsa.snd_pcm_hw_params_test_format = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_test_channels");
  (pContext->field_14).alsa.snd_pcm_hw_params_test_channels = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params_test_rate");
  (pContext->field_14).alsa.snd_pcm_hw_params_test_rate = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_hw_params");
  (pContext->field_14).alsa.snd_pcm_hw_params = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_sw_params_sizeof");
  (pContext->field_14).alsa.snd_pcm_sw_params_sizeof = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_sw_params_current");
  (pContext->field_14).alsa.snd_pcm_sw_params_current = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_sw_params_get_boundary");
  (pContext->field_14).alsa.snd_pcm_sw_params_get_boundary = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_sw_params_set_avail_min");
  (pContext->field_14).alsa.snd_pcm_sw_params_set_avail_min = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,
                    "snd_pcm_sw_params_set_start_threshold");
  (pContext->field_14).alsa.snd_pcm_sw_params_set_start_threshold = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,
                    "snd_pcm_sw_params_set_stop_threshold");
  (pContext->field_14).alsa.snd_pcm_sw_params_set_stop_threshold = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_sw_params");
  (pContext->field_14).alsa.snd_pcm_sw_params = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_format_mask_sizeof");
  (pContext->field_14).alsa.snd_pcm_format_mask_sizeof = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_format_mask_test");
  (pContext->field_14).alsa.snd_pcm_format_mask_test = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_get_chmap");
  (pContext->field_14).alsa.snd_pcm_get_chmap = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_state");
  (pContext->field_14).alsa.snd_pcm_state = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_prepare");
  (pContext->field_14).alsa.snd_pcm_prepare = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_start");
  (pContext->field_14).alsa.snd_pcm_start = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_drop");
  (pContext->field_14).alsa.snd_pcm_drop = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_drain");
  (pContext->field_14).alsa.snd_pcm_drain = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_reset");
  (pContext->field_14).alsa.snd_pcm_reset = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_device_name_hint");
  (pContext->field_14).alsa.snd_device_name_hint = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_device_name_get_hint");
  (pContext->field_14).alsa.snd_device_name_get_hint = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_card_get_index");
  (pContext->field_14).alsa.snd_card_get_index = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_device_name_free_hint");
  (pContext->field_14).alsa.snd_device_name_free_hint = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_mmap_begin");
  (pContext->field_14).alsa.snd_pcm_mmap_begin = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_mmap_commit");
  (pContext->field_14).alsa.snd_pcm_mmap_commit = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_recover");
  (pContext->field_14).alsa.snd_pcm_recover = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_readi");
  (pContext->field_14).alsa.snd_pcm_readi = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_writei");
  (pContext->field_14).alsa.snd_pcm_writei = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_avail");
  (pContext->field_14).alsa.snd_pcm_avail = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_avail_update");
  (pContext->field_14).alsa.snd_pcm_avail_update = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_wait");
  (pContext->field_14).alsa.snd_pcm_wait = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_nonblock");
  (pContext->field_14).alsa.snd_pcm_nonblock = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_info");
  (pContext->field_14).alsa.snd_pcm_info = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_info_sizeof");
  (pContext->field_14).alsa.snd_pcm_info_sizeof = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_info_get_name");
  (pContext->field_14).alsa.snd_pcm_info_get_name = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_poll_descriptors");
  (pContext->field_14).alsa.snd_pcm_poll_descriptors = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_poll_descriptors_count");
  (pContext->field_14).alsa.snd_pcm_poll_descriptors_count = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_pcm_poll_descriptors_revents");
  (pContext->field_14).alsa.snd_pcm_poll_descriptors_revents = p_Var2;
  p_Var2 = ma_dlsym(pContext,(pContext->field_14).alsa.asoundSO,"snd_config_update_free_global");
  (pContext->field_14).alsa.snd_config_update_free_global = p_Var2;
  (pContext->field_14).alsa.useVerboseDeviceEnumeration =
       (pConfig->alsa).useVerboseDeviceEnumeration;
  mVar1 = ma_mutex_init(&(pContext->field_14).alsa.internalDeviceEnumLock);
  if (mVar1 == MA_SUCCESS) {
    pCallbacks->onContextInit = ma_context_init__alsa;
    pCallbacks->onContextUninit = ma_context_uninit__alsa;
    pCallbacks->onContextEnumerateDevices = ma_context_enumerate_devices__alsa;
    pCallbacks->onContextGetDeviceInfo = ma_context_get_device_info__alsa;
    pCallbacks->onDeviceInit = ma_device_init__alsa;
    pCallbacks->onDeviceUninit = ma_device_uninit__alsa;
    pCallbacks->onDeviceStart = ma_device_start__alsa;
    pCallbacks->onDeviceStop = ma_device_stop__alsa;
    pCallbacks->onDeviceRead = ma_device_read__alsa;
    pCallbacks->onDeviceWrite = ma_device_write__alsa;
    pCallbacks->onDeviceDataLoop = (_func_ma_result_ma_device_ptr *)0x0;
    pCallbacks->onDeviceDataLoopWakeup = ma_device_data_loop_wakeup__alsa;
    mVar1 = MA_SUCCESS;
  }
  else {
    ma_log_postf(pContext->pLog,1,
                 "[ALSA] WARNING: Failed to initialize mutex for internal device enumeration.");
  }
  return mVar1;
}

Assistant:

static ma_result ma_context_init__alsa(ma_context* pContext, const ma_context_config* pConfig, ma_backend_callbacks* pCallbacks)
{
    ma_result result;
#ifndef MA_NO_RUNTIME_LINKING
    const char* libasoundNames[] = {
        "libasound.so.2",
        "libasound.so"
    };
    size_t i;

    for (i = 0; i < ma_countof(libasoundNames); ++i) {
        pContext->alsa.asoundSO = ma_dlopen(pContext, libasoundNames[i]);
        if (pContext->alsa.asoundSO != NULL) {
            break;
        }
    }

    if (pContext->alsa.asoundSO == NULL) {
        ma_log_postf(ma_context_get_log(pContext), MA_LOG_LEVEL_DEBUG, "[ALSA] Failed to open shared object.\n");
        return MA_NO_BACKEND;
    }

    pContext->alsa.snd_pcm_open                           = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_open");
    pContext->alsa.snd_pcm_close                          = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_close");
    pContext->alsa.snd_pcm_hw_params_sizeof               = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_sizeof");
    pContext->alsa.snd_pcm_hw_params_any                  = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_any");
    pContext->alsa.snd_pcm_hw_params_set_format           = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_set_format");
    pContext->alsa.snd_pcm_hw_params_set_format_first     = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_set_format_first");
    pContext->alsa.snd_pcm_hw_params_get_format_mask      = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_get_format_mask");
    pContext->alsa.snd_pcm_hw_params_set_channels         = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_set_channels");
    pContext->alsa.snd_pcm_hw_params_set_channels_near    = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_set_channels_near");
    pContext->alsa.snd_pcm_hw_params_set_channels_minmax  = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_set_channels_minmax");
    pContext->alsa.snd_pcm_hw_params_set_rate_resample    = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_set_rate_resample");
    pContext->alsa.snd_pcm_hw_params_set_rate             = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_set_rate");
    pContext->alsa.snd_pcm_hw_params_set_rate_near        = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_set_rate_near");
    pContext->alsa.snd_pcm_hw_params_set_buffer_size_near = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_set_buffer_size_near");
    pContext->alsa.snd_pcm_hw_params_set_periods_near     = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_set_periods_near");
    pContext->alsa.snd_pcm_hw_params_set_access           = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_set_access");
    pContext->alsa.snd_pcm_hw_params_get_format           = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_get_format");
    pContext->alsa.snd_pcm_hw_params_get_channels         = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_get_channels");
    pContext->alsa.snd_pcm_hw_params_get_channels_min     = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_get_channels_min");
    pContext->alsa.snd_pcm_hw_params_get_channels_max     = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_get_channels_max");
    pContext->alsa.snd_pcm_hw_params_get_rate             = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_get_rate");
    pContext->alsa.snd_pcm_hw_params_get_rate_min         = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_get_rate_min");
    pContext->alsa.snd_pcm_hw_params_get_rate_max         = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_get_rate_max");
    pContext->alsa.snd_pcm_hw_params_get_buffer_size      = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_get_buffer_size");
    pContext->alsa.snd_pcm_hw_params_get_periods          = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_get_periods");
    pContext->alsa.snd_pcm_hw_params_get_access           = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_get_access");
    pContext->alsa.snd_pcm_hw_params_test_format          = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_test_format");
    pContext->alsa.snd_pcm_hw_params_test_channels        = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_test_channels");
    pContext->alsa.snd_pcm_hw_params_test_rate            = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params_test_rate");
    pContext->alsa.snd_pcm_hw_params                      = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_hw_params");
    pContext->alsa.snd_pcm_sw_params_sizeof               = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_sw_params_sizeof");
    pContext->alsa.snd_pcm_sw_params_current              = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_sw_params_current");
    pContext->alsa.snd_pcm_sw_params_get_boundary         = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_sw_params_get_boundary");
    pContext->alsa.snd_pcm_sw_params_set_avail_min        = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_sw_params_set_avail_min");
    pContext->alsa.snd_pcm_sw_params_set_start_threshold  = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_sw_params_set_start_threshold");
    pContext->alsa.snd_pcm_sw_params_set_stop_threshold   = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_sw_params_set_stop_threshold");
    pContext->alsa.snd_pcm_sw_params                      = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_sw_params");
    pContext->alsa.snd_pcm_format_mask_sizeof             = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_format_mask_sizeof");
    pContext->alsa.snd_pcm_format_mask_test               = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_format_mask_test");
    pContext->alsa.snd_pcm_get_chmap                      = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_get_chmap");
    pContext->alsa.snd_pcm_state                          = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_state");
    pContext->alsa.snd_pcm_prepare                        = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_prepare");
    pContext->alsa.snd_pcm_start                          = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_start");
    pContext->alsa.snd_pcm_drop                           = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_drop");
    pContext->alsa.snd_pcm_drain                          = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_drain");
    pContext->alsa.snd_pcm_reset                          = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_reset");
    pContext->alsa.snd_device_name_hint                   = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_device_name_hint");
    pContext->alsa.snd_device_name_get_hint               = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_device_name_get_hint");
    pContext->alsa.snd_card_get_index                     = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_card_get_index");
    pContext->alsa.snd_device_name_free_hint              = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_device_name_free_hint");
    pContext->alsa.snd_pcm_mmap_begin                     = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_mmap_begin");
    pContext->alsa.snd_pcm_mmap_commit                    = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_mmap_commit");
    pContext->alsa.snd_pcm_recover                        = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_recover");
    pContext->alsa.snd_pcm_readi                          = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_readi");
    pContext->alsa.snd_pcm_writei                         = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_writei");
    pContext->alsa.snd_pcm_avail                          = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_avail");
    pContext->alsa.snd_pcm_avail_update                   = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_avail_update");
    pContext->alsa.snd_pcm_wait                           = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_wait");
    pContext->alsa.snd_pcm_nonblock                       = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_nonblock");
    pContext->alsa.snd_pcm_info                           = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_info");
    pContext->alsa.snd_pcm_info_sizeof                    = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_info_sizeof");
    pContext->alsa.snd_pcm_info_get_name                  = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_info_get_name");
    pContext->alsa.snd_pcm_poll_descriptors               = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_poll_descriptors");
    pContext->alsa.snd_pcm_poll_descriptors_count         = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_poll_descriptors_count");
    pContext->alsa.snd_pcm_poll_descriptors_revents       = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_pcm_poll_descriptors_revents");
    pContext->alsa.snd_config_update_free_global          = (ma_proc)ma_dlsym(pContext, pContext->alsa.asoundSO, "snd_config_update_free_global");
#else
    /* The system below is just for type safety. */
    ma_snd_pcm_open_proc                           _snd_pcm_open                           = snd_pcm_open;
    ma_snd_pcm_close_proc                          _snd_pcm_close                          = snd_pcm_close;
    ma_snd_pcm_hw_params_sizeof_proc               _snd_pcm_hw_params_sizeof               = snd_pcm_hw_params_sizeof;
    ma_snd_pcm_hw_params_any_proc                  _snd_pcm_hw_params_any                  = snd_pcm_hw_params_any;
    ma_snd_pcm_hw_params_set_format_proc           _snd_pcm_hw_params_set_format           = snd_pcm_hw_params_set_format;
    ma_snd_pcm_hw_params_set_format_first_proc     _snd_pcm_hw_params_set_format_first     = snd_pcm_hw_params_set_format_first;
    ma_snd_pcm_hw_params_get_format_mask_proc      _snd_pcm_hw_params_get_format_mask      = snd_pcm_hw_params_get_format_mask;
    ma_snd_pcm_hw_params_set_channels_proc         _snd_pcm_hw_params_set_channels         = snd_pcm_hw_params_set_channels;
    ma_snd_pcm_hw_params_set_channels_near_proc    _snd_pcm_hw_params_set_channels_near    = snd_pcm_hw_params_set_channels_near;
    ma_snd_pcm_hw_params_set_rate_resample_proc    _snd_pcm_hw_params_set_rate_resample    = snd_pcm_hw_params_set_rate_resample;
    ma_snd_pcm_hw_params_set_rate_near             _snd_pcm_hw_params_set_rate             = snd_pcm_hw_params_set_rate;
    ma_snd_pcm_hw_params_set_rate_near_proc        _snd_pcm_hw_params_set_rate_near        = snd_pcm_hw_params_set_rate_near;
    ma_snd_pcm_hw_params_set_rate_minmax_proc      _snd_pcm_hw_params_set_rate_minmax      = snd_pcm_hw_params_set_rate_minmax;
    ma_snd_pcm_hw_params_set_buffer_size_near_proc _snd_pcm_hw_params_set_buffer_size_near = snd_pcm_hw_params_set_buffer_size_near;
    ma_snd_pcm_hw_params_set_periods_near_proc     _snd_pcm_hw_params_set_periods_near     = snd_pcm_hw_params_set_periods_near;
    ma_snd_pcm_hw_params_set_access_proc           _snd_pcm_hw_params_set_access           = snd_pcm_hw_params_set_access;
    ma_snd_pcm_hw_params_get_format_proc           _snd_pcm_hw_params_get_format           = snd_pcm_hw_params_get_format;
    ma_snd_pcm_hw_params_get_channels_proc         _snd_pcm_hw_params_get_channels         = snd_pcm_hw_params_get_channels;
    ma_snd_pcm_hw_params_get_channels_min_proc     _snd_pcm_hw_params_get_channels_min     = snd_pcm_hw_params_get_channels_min;
    ma_snd_pcm_hw_params_get_channels_max_proc     _snd_pcm_hw_params_get_channels_max     = snd_pcm_hw_params_get_channels_max;
    ma_snd_pcm_hw_params_get_rate_proc             _snd_pcm_hw_params_get_rate             = snd_pcm_hw_params_get_rate;
    ma_snd_pcm_hw_params_get_rate_min_proc         _snd_pcm_hw_params_get_rate_min         = snd_pcm_hw_params_get_rate_min;
    ma_snd_pcm_hw_params_get_rate_max_proc         _snd_pcm_hw_params_get_rate_max         = snd_pcm_hw_params_get_rate_max;
    ma_snd_pcm_hw_params_get_buffer_size_proc      _snd_pcm_hw_params_get_buffer_size      = snd_pcm_hw_params_get_buffer_size;
    ma_snd_pcm_hw_params_get_periods_proc          _snd_pcm_hw_params_get_periods          = snd_pcm_hw_params_get_periods;
    ma_snd_pcm_hw_params_get_access_proc           _snd_pcm_hw_params_get_access           = snd_pcm_hw_params_get_access;
    ma_snd_pcm_hw_params_test_format_proc          _snd_pcm_hw_params_test_format          = snd_pcm_hw_params_test_format;
    ma_snd_pcm_hw_params_test_channels_proc        _snd_pcm_hw_params_test_channels        = snd_pcm_hw_params_test_channels;
    ma_snd_pcm_hw_params_test_rate_proc            _snd_pcm_hw_params_test_rate            = snd_pcm_hw_params_test_rate;
    ma_snd_pcm_hw_params_proc                      _snd_pcm_hw_params                      = snd_pcm_hw_params;
    ma_snd_pcm_sw_params_sizeof_proc               _snd_pcm_sw_params_sizeof               = snd_pcm_sw_params_sizeof;
    ma_snd_pcm_sw_params_current_proc              _snd_pcm_sw_params_current              = snd_pcm_sw_params_current;
    ma_snd_pcm_sw_params_get_boundary_proc         _snd_pcm_sw_params_get_boundary         = snd_pcm_sw_params_get_boundary;
    ma_snd_pcm_sw_params_set_avail_min_proc        _snd_pcm_sw_params_set_avail_min        = snd_pcm_sw_params_set_avail_min;
    ma_snd_pcm_sw_params_set_start_threshold_proc  _snd_pcm_sw_params_set_start_threshold  = snd_pcm_sw_params_set_start_threshold;
    ma_snd_pcm_sw_params_set_stop_threshold_proc   _snd_pcm_sw_params_set_stop_threshold   = snd_pcm_sw_params_set_stop_threshold;
    ma_snd_pcm_sw_params_proc                      _snd_pcm_sw_params                      = snd_pcm_sw_params;
    ma_snd_pcm_format_mask_sizeof_proc             _snd_pcm_format_mask_sizeof             = snd_pcm_format_mask_sizeof;
    ma_snd_pcm_format_mask_test_proc               _snd_pcm_format_mask_test               = snd_pcm_format_mask_test;
    ma_snd_pcm_get_chmap_proc                      _snd_pcm_get_chmap                      = snd_pcm_get_chmap;
    ma_snd_pcm_state_proc                          _snd_pcm_state                          = snd_pcm_state;
    ma_snd_pcm_prepare_proc                        _snd_pcm_prepare                        = snd_pcm_prepare;
    ma_snd_pcm_start_proc                          _snd_pcm_start                          = snd_pcm_start;
    ma_snd_pcm_drop_proc                           _snd_pcm_drop                           = snd_pcm_drop;
    ma_snd_pcm_drain_proc                          _snd_pcm_drain                          = snd_pcm_drain;
    ma_snd_pcm_reset_proc                          _snd_pcm_reset                          = snd_pcm_reset;
    ma_snd_device_name_hint_proc                   _snd_device_name_hint                   = snd_device_name_hint;
    ma_snd_device_name_get_hint_proc               _snd_device_name_get_hint               = snd_device_name_get_hint;
    ma_snd_card_get_index_proc                     _snd_card_get_index                     = snd_card_get_index;
    ma_snd_device_name_free_hint_proc              _snd_device_name_free_hint              = snd_device_name_free_hint;
    ma_snd_pcm_mmap_begin_proc                     _snd_pcm_mmap_begin                     = snd_pcm_mmap_begin;
    ma_snd_pcm_mmap_commit_proc                    _snd_pcm_mmap_commit                    = snd_pcm_mmap_commit;
    ma_snd_pcm_recover_proc                        _snd_pcm_recover                        = snd_pcm_recover;
    ma_snd_pcm_readi_proc                          _snd_pcm_readi                          = snd_pcm_readi;
    ma_snd_pcm_writei_proc                         _snd_pcm_writei                         = snd_pcm_writei;
    ma_snd_pcm_avail_proc                          _snd_pcm_avail                          = snd_pcm_avail;
    ma_snd_pcm_avail_update_proc                   _snd_pcm_avail_update                   = snd_pcm_avail_update;
    ma_snd_pcm_wait_proc                           _snd_pcm_wait                           = snd_pcm_wait;
    ma_snd_pcm_nonblock_proc                       _snd_pcm_nonblock                       = snd_pcm_nonblock;
    ma_snd_pcm_info_proc                           _snd_pcm_info                           = snd_pcm_info;
    ma_snd_pcm_info_sizeof_proc                    _snd_pcm_info_sizeof                    = snd_pcm_info_sizeof;
    ma_snd_pcm_info_get_name_proc                  _snd_pcm_info_get_name                  = snd_pcm_info_get_name;
    ma_snd_pcm_poll_descriptors                    _snd_pcm_poll_descriptors               = snd_pcm_poll_descriptors;
    ma_snd_pcm_poll_descriptors_count              _snd_pcm_poll_descriptors_count         = snd_pcm_poll_descriptors_count;
    ma_snd_pcm_poll_descriptors_revents            _snd_pcm_poll_descriptors_revents       = snd_pcm_poll_descriptors_revents;
    ma_snd_config_update_free_global_proc          _snd_config_update_free_global          = snd_config_update_free_global;

    pContext->alsa.snd_pcm_open                           = (ma_proc)_snd_pcm_open;
    pContext->alsa.snd_pcm_close                          = (ma_proc)_snd_pcm_close;
    pContext->alsa.snd_pcm_hw_params_sizeof               = (ma_proc)_snd_pcm_hw_params_sizeof;
    pContext->alsa.snd_pcm_hw_params_any                  = (ma_proc)_snd_pcm_hw_params_any;
    pContext->alsa.snd_pcm_hw_params_set_format           = (ma_proc)_snd_pcm_hw_params_set_format;
    pContext->alsa.snd_pcm_hw_params_set_format_first     = (ma_proc)_snd_pcm_hw_params_set_format_first;
    pContext->alsa.snd_pcm_hw_params_get_format_mask      = (ma_proc)_snd_pcm_hw_params_get_format_mask;
    pContext->alsa.snd_pcm_hw_params_set_channels         = (ma_proc)_snd_pcm_hw_params_set_channels;
    pContext->alsa.snd_pcm_hw_params_set_channels_near    = (ma_proc)_snd_pcm_hw_params_set_channels_near;
    pContext->alsa.snd_pcm_hw_params_set_channels_minmax  = (ma_proc)_snd_pcm_hw_params_set_channels_minmax;
    pContext->alsa.snd_pcm_hw_params_set_rate_resample    = (ma_proc)_snd_pcm_hw_params_set_rate_resample;
    pContext->alsa.snd_pcm_hw_params_set_rate             = (ma_proc)_snd_pcm_hw_params_set_rate;
    pContext->alsa.snd_pcm_hw_params_set_rate_near        = (ma_proc)_snd_pcm_hw_params_set_rate_near;
    pContext->alsa.snd_pcm_hw_params_set_buffer_size_near = (ma_proc)_snd_pcm_hw_params_set_buffer_size_near;
    pContext->alsa.snd_pcm_hw_params_set_periods_near     = (ma_proc)_snd_pcm_hw_params_set_periods_near;
    pContext->alsa.snd_pcm_hw_params_set_access           = (ma_proc)_snd_pcm_hw_params_set_access;
    pContext->alsa.snd_pcm_hw_params_get_format           = (ma_proc)_snd_pcm_hw_params_get_format;
    pContext->alsa.snd_pcm_hw_params_get_channels         = (ma_proc)_snd_pcm_hw_params_get_channels;
    pContext->alsa.snd_pcm_hw_params_get_channels_min     = (ma_proc)_snd_pcm_hw_params_get_channels_min;
    pContext->alsa.snd_pcm_hw_params_get_channels_max     = (ma_proc)_snd_pcm_hw_params_get_channels_max;
    pContext->alsa.snd_pcm_hw_params_get_rate             = (ma_proc)_snd_pcm_hw_params_get_rate;
    pContext->alsa.snd_pcm_hw_params_get_rate_min         = (ma_proc)_snd_pcm_hw_params_get_rate_min;
    pContext->alsa.snd_pcm_hw_params_get_rate_max         = (ma_proc)_snd_pcm_hw_params_get_rate_max;
    pContext->alsa.snd_pcm_hw_params_get_buffer_size      = (ma_proc)_snd_pcm_hw_params_get_buffer_size;
    pContext->alsa.snd_pcm_hw_params_get_periods          = (ma_proc)_snd_pcm_hw_params_get_periods;
    pContext->alsa.snd_pcm_hw_params_get_access           = (ma_proc)_snd_pcm_hw_params_get_access;
    pContext->alsa.snd_pcm_hw_params_test_format          = (ma_proc)_snd_pcm_hw_params_test_format;
    pContext->alsa.snd_pcm_hw_params_test_channels        = (ma_proc)_snd_pcm_hw_params_test_channels;
    pContext->alsa.snd_pcm_hw_params_test_rate            = (ma_proc)_snd_pcm_hw_params_test_rate;
    pContext->alsa.snd_pcm_hw_params                      = (ma_proc)_snd_pcm_hw_params;
    pContext->alsa.snd_pcm_sw_params_sizeof               = (ma_proc)_snd_pcm_sw_params_sizeof;
    pContext->alsa.snd_pcm_sw_params_current              = (ma_proc)_snd_pcm_sw_params_current;
    pContext->alsa.snd_pcm_sw_params_get_boundary         = (ma_proc)_snd_pcm_sw_params_get_boundary;
    pContext->alsa.snd_pcm_sw_params_set_avail_min        = (ma_proc)_snd_pcm_sw_params_set_avail_min;
    pContext->alsa.snd_pcm_sw_params_set_start_threshold  = (ma_proc)_snd_pcm_sw_params_set_start_threshold;
    pContext->alsa.snd_pcm_sw_params_set_stop_threshold   = (ma_proc)_snd_pcm_sw_params_set_stop_threshold;
    pContext->alsa.snd_pcm_sw_params                      = (ma_proc)_snd_pcm_sw_params;
    pContext->alsa.snd_pcm_format_mask_sizeof             = (ma_proc)_snd_pcm_format_mask_sizeof;
    pContext->alsa.snd_pcm_format_mask_test               = (ma_proc)_snd_pcm_format_mask_test;
    pContext->alsa.snd_pcm_get_chmap                      = (ma_proc)_snd_pcm_get_chmap;
    pContext->alsa.snd_pcm_state                          = (ma_proc)_snd_pcm_state;
    pContext->alsa.snd_pcm_prepare                        = (ma_proc)_snd_pcm_prepare;
    pContext->alsa.snd_pcm_start                          = (ma_proc)_snd_pcm_start;
    pContext->alsa.snd_pcm_drop                           = (ma_proc)_snd_pcm_drop;
    pContext->alsa.snd_pcm_drain                          = (ma_proc)_snd_pcm_drain;
    pContext->alsa.snd_pcm_reset                          = (ma_proc)_snd_pcm_reset;
    pContext->alsa.snd_device_name_hint                   = (ma_proc)_snd_device_name_hint;
    pContext->alsa.snd_device_name_get_hint               = (ma_proc)_snd_device_name_get_hint;
    pContext->alsa.snd_card_get_index                     = (ma_proc)_snd_card_get_index;
    pContext->alsa.snd_device_name_free_hint              = (ma_proc)_snd_device_name_free_hint;
    pContext->alsa.snd_pcm_mmap_begin                     = (ma_proc)_snd_pcm_mmap_begin;
    pContext->alsa.snd_pcm_mmap_commit                    = (ma_proc)_snd_pcm_mmap_commit;
    pContext->alsa.snd_pcm_recover                        = (ma_proc)_snd_pcm_recover;
    pContext->alsa.snd_pcm_readi                          = (ma_proc)_snd_pcm_readi;
    pContext->alsa.snd_pcm_writei                         = (ma_proc)_snd_pcm_writei;
    pContext->alsa.snd_pcm_avail                          = (ma_proc)_snd_pcm_avail;
    pContext->alsa.snd_pcm_avail_update                   = (ma_proc)_snd_pcm_avail_update;
    pContext->alsa.snd_pcm_wait                           = (ma_proc)_snd_pcm_wait;
    pContext->alsa.snd_pcm_nonblock                       = (ma_proc)_snd_pcm_nonblock;
    pContext->alsa.snd_pcm_info                           = (ma_proc)_snd_pcm_info;
    pContext->alsa.snd_pcm_info_sizeof                    = (ma_proc)_snd_pcm_info_sizeof;
    pContext->alsa.snd_pcm_info_get_name                  = (ma_proc)_snd_pcm_info_get_name;
    pContext->alsa.snd_pcm_poll_descriptors               = (ma_proc)_snd_pcm_poll_descriptors;
    pContext->alsa.snd_pcm_poll_descriptors_count         = (ma_proc)_snd_pcm_poll_descriptors_count;
    pContext->alsa.snd_pcm_poll_descriptors_revents       = (ma_proc)_snd_pcm_poll_descriptors_revents;
    pContext->alsa.snd_config_update_free_global          = (ma_proc)_snd_config_update_free_global;
#endif

    pContext->alsa.useVerboseDeviceEnumeration = pConfig->alsa.useVerboseDeviceEnumeration;

    result = ma_mutex_init(&pContext->alsa.internalDeviceEnumLock);
    if (result != MA_SUCCESS) {
        ma_log_postf(ma_context_get_log(pContext), MA_LOG_LEVEL_ERROR, "[ALSA] WARNING: Failed to initialize mutex for internal device enumeration.");
        return result;
    }

    pCallbacks->onContextInit             = ma_context_init__alsa;
    pCallbacks->onContextUninit           = ma_context_uninit__alsa;
    pCallbacks->onContextEnumerateDevices = ma_context_enumerate_devices__alsa;
    pCallbacks->onContextGetDeviceInfo    = ma_context_get_device_info__alsa;
    pCallbacks->onDeviceInit              = ma_device_init__alsa;
    pCallbacks->onDeviceUninit            = ma_device_uninit__alsa;
    pCallbacks->onDeviceStart             = ma_device_start__alsa;
    pCallbacks->onDeviceStop              = ma_device_stop__alsa;
    pCallbacks->onDeviceRead              = ma_device_read__alsa;
    pCallbacks->onDeviceWrite             = ma_device_write__alsa;
    pCallbacks->onDeviceDataLoop          = NULL;
    pCallbacks->onDeviceDataLoopWakeup    = ma_device_data_loop_wakeup__alsa;

    return MA_SUCCESS;
}